

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O2

int dwarf_load_loclists(Dwarf_Debug dbg,Dwarf_Unsigned *loclists_count,Dwarf_Error *error)

{
  Dwarf_Chain pDVar1;
  Dwarf_Error *error_00;
  Dwarf_Unsigned DVar2;
  int iVar3;
  Dwarf_Loclists_Context buildhere;
  Dwarf_Chain pDVar4;
  Dwarf_Loclists_Context *ppDVar5;
  char *msg;
  size_t __size;
  Dwarf_Small *pDVar6;
  Dwarf_Small *data;
  Dwarf_Unsigned DVar7;
  Dwarf_Chain *ppDVar8;
  Dwarf_Signed errval;
  Dwarf_Chain local_70;
  Dwarf_Error *local_68;
  Dwarf_Unsigned local_60;
  Dwarf_Unsigned local_58;
  Dwarf_Small *local_50;
  Dwarf_Unsigned nextoffset;
  Dwarf_Unsigned *local_40;
  size_t local_38;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_load_loclists()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    if (dbg->de_loclists_context != (Dwarf_Loclists_Context *)0x0) {
      if (loclists_count != (Dwarf_Unsigned *)0x0) {
        *loclists_count = dbg->de_loclists_context_count;
        return 0;
      }
      return 0;
    }
    local_60 = (dbg->de_debug_loclists).dss_size;
    if (local_60 == 0) {
      return -1;
    }
    pDVar6 = (dbg->de_debug_loclists).dss_data;
    if (pDVar6 == (Dwarf_Small *)0x0) {
      iVar3 = _dwarf_load_section(dbg,&dbg->de_debug_loclists,error);
      if (iVar3 != 0) {
        return iVar3;
      }
      pDVar6 = (dbg->de_debug_loclists).dss_data;
      local_60 = (dbg->de_debug_loclists).dss_size;
    }
    nextoffset = 0;
    local_50 = pDVar6 + local_60;
    ppDVar8 = &local_70;
    local_70 = (Dwarf_Chain)0x0;
    __size = 0;
    local_58 = 0;
    data = pDVar6;
    local_68 = error;
    local_40 = loclists_count;
    while (DVar2 = nextoffset, data < local_50) {
      local_38 = __size;
      buildhere = (Dwarf_Loclists_Context)calloc(1,0x78);
      error_00 = local_68;
      if (buildhere == (Dwarf_Loclists_Context)0x0) {
        free_loclists_chain(dbg,local_70);
        msg = "DW_DLE_ALLOC_FAIL: Allocation of Loclists_Context failed";
        goto LAB_001c4e83;
      }
      iVar3 = _dwarf_internal_read_loclists_header
                        (dbg,1,local_58,local_60,data,local_50,DVar2,buildhere,&nextoffset,local_68)
      ;
      if (iVar3 == 1) {
LAB_001c4e30:
        free_loclists_chain(dbg,local_70);
        free_loclists_context(buildhere);
        return 1;
      }
      buildhere->lc_magic = 0xadab4;
      pDVar4 = (Dwarf_Chain)_dwarf_get_alloc(dbg,'\x1f',1);
      if (pDVar4 == (Dwarf_Chain)0x0) {
        _dwarf_error_string(dbg,error_00,0x3e,
                            "DW_DLE_ALLOC_FAIL: allocating Loclists_Context chain entry");
        goto LAB_001c4e30;
      }
      pDVar4->ch_item = buildhere;
      local_58 = local_58 + 1;
      *ppDVar8 = pDVar4;
      ppDVar8 = &pDVar4->ch_next;
      __size = local_38 + 8;
      data = pDVar6 + nextoffset;
    }
    ppDVar5 = (Dwarf_Loclists_Context *)malloc(__size);
    DVar2 = local_58;
    if (ppDVar5 != (Dwarf_Loclists_Context *)0x0) {
      pDVar4 = local_70;
      for (DVar7 = 0; DVar2 != DVar7; DVar7 = DVar7 + 1) {
        ppDVar5[DVar7] = (Dwarf_Loclists_Context)pDVar4->ch_item;
        pDVar4->ch_item = (void *)0x0;
        pDVar1 = pDVar4->ch_next;
        dwarf_dealloc(dbg,pDVar4,0x1f);
        pDVar4 = pDVar1;
      }
      dbg->de_loclists_context = ppDVar5;
      dbg->de_loclists_context_count = DVar2;
      if (local_40 != (Dwarf_Unsigned *)0x0) {
        *local_40 = DVar2;
        return 0;
      }
      return 0;
    }
    free_loclists_chain(dbg,local_70);
    msg = "Allocation of Loclists_Context pointer array failed";
LAB_001c4e83:
    errval = 0x3e;
    error = local_68;
  }
  _dwarf_error_string(dbg,error,errval,msg);
  return 1;
}

Assistant:

int
dwarf_load_loclists(Dwarf_Debug dbg,
    Dwarf_Unsigned *loclists_count,
    Dwarf_Error *error)
{
    int res = DW_DLV_ERROR;
    Dwarf_Loclists_Context *cxt = 0;
    Dwarf_Unsigned count = 0;

    CHECK_DBG(dbg,error,"dwarf_load_loclists()");
    if (dbg->de_loclists_context) {
        if (loclists_count) {
            *loclists_count = dbg->de_loclists_context_count;
        }
        return DW_DLV_OK;
    }
    if (!dbg->de_debug_loclists.dss_size) {
        /* nothing there. */
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_debug_loclists.dss_data) {
        res = _dwarf_load_section(dbg, &dbg->de_debug_loclists,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    /*  cxt is set to a pointer to a context, which is
        actually an array of pointers to such contexts, 'count'
        of them. Each context has the loclists offset table
        (if it has at least on entry in the table)
        pointed in each cxt. */
    res = internal_load_loclists_contexts(dbg,&cxt,&count,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    dbg->de_loclists_context = cxt;
    dbg->de_loclists_context_count = count;
    if (loclists_count) {
        *loclists_count = count;
    }
    return DW_DLV_OK;
}